

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferWriteTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::RecreateBufferDataStoreCase::iterate(RecreateBufferDataStoreCase *this)

{
  int iVar1;
  int iVar2;
  GLenum target;
  RenderContext *renderCtx;
  uint uVar3;
  bool bVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  uint uVar7;
  char *str;
  TestLog *log;
  pointer pDVar8;
  deUint8 *pdVar9;
  iterator iStack_60;
  bool iterOk;
  __normal_iterator<deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
  local_58;
  __normal_iterator<const_deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
  local_50;
  const_iterator spec;
  deUint32 buf;
  undefined1 local_38 [8];
  ReferenceBuffer refBuf;
  BufferVerifier verifier;
  deUint32 baseSeed;
  RecreateBufferDataStoreCase *this_local;
  
  str = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(str);
  renderCtx = (this->super_BufferCase).m_renderCtx;
  log = tcu::TestContext::getLog((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier
            ((BufferVerifier *)
             &refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,renderCtx,log,this->m_verify);
  deqp::gls::BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)local_38);
  spec._M_current._0_4_ = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_58._M_current =
       (DataStoreSpec *)
       std::
       vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
       ::begin(&this->m_specs);
  __gnu_cxx::
  __normal_iterator<deqp::gles3::Functional::DataStoreSpec_const*,std::vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>>
  ::__normal_iterator<deqp::gles3::Functional::DataStoreSpec*>
            ((__normal_iterator<deqp::gles3::Functional::DataStoreSpec_const*,std::vector<deqp::gles3::Functional::DataStoreSpec,std::allocator<deqp::gles3::Functional::DataStoreSpec>>>
              *)&local_50,&local_58);
  do {
    iStack_60 = std::
                vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>
                ::end(&this->m_specs);
    bVar4 = __gnu_cxx::operator!=(&local_50,&stack0xffffffffffffffa0);
    if (!bVar4) {
LAB_00b2eb6b:
      deqp::gls::BufferTestUtil::BufferCase::deleteBuffer
                (&this->super_BufferCase,(deUint32)spec._M_current);
      deqp::gls::BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)local_38);
      deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier
                ((BufferVerifier *)
                 &refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      return STOP;
    }
    pDVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    deqp::gls::BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)local_38,pDVar8->size);
    pdVar9 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    pDVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    iVar1 = pDVar8->size;
    pDVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    iVar2 = pDVar8->size;
    pDVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    dVar6 = pDVar8->target;
    pDVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    dVar6 = ::deInt32Hash(iVar2 + dVar6 + pDVar8->usage);
    deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar9,iVar1,dVar5 ^ 0xbeef ^ dVar6);
    pDVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BufferCase).super_CallLogWrapper,pDVar8->target,
               (deUint32)spec._M_current);
    pDVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    target = pDVar8->target;
    pDVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    iVar1 = pDVar8->size;
    pdVar9 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    pDVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BufferCase).super_CallLogWrapper,target,(long)iVar1,pdVar9,
               pDVar8->usage);
    deqp::gls::BufferTestUtil::BufferCase::checkError(&this->super_BufferCase);
    uVar3 = (deUint32)spec._M_current;
    pdVar9 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    pDVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    uVar7 = pDVar8->size;
    pDVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    uVar7 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                      ((BufferVerifier *)
                       &refBuf.m_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(EVP_PKEY_CTX *)(ulong)uVar3,
                       pdVar9,0,(uchar *)(ulong)uVar7,(ulong)pDVar8->target);
    if ((uVar7 & 1) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Fail");
      goto LAB_00b2eb6b;
    }
    __gnu_cxx::
    __normal_iterator<const_deqp::gles3::Functional::DataStoreSpec_*,_std::vector<deqp::gles3::Functional::DataStoreSpec,_std::allocator<deqp::gles3::Functional::DataStoreSpec>_>_>
    ::operator++(&local_50,0);
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32			baseSeed	= deStringHash(getName()) ^ 0xbeef;
		BufferVerifier			verifier	(m_renderCtx, m_testCtx.getLog(), m_verify);
		ReferenceBuffer			refBuf;
		const deUint32			buf			= genBuffer();

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		for (vector<DataStoreSpec>::const_iterator spec = m_specs.begin(); spec != m_specs.end(); spec++)
		{
			bool iterOk = false;

			refBuf.setSize(spec->size);
			fillWithRandomBytes(refBuf.getPtr(), spec->size, baseSeed ^ deInt32Hash(spec->size+spec->target+spec->usage));

			glBindBuffer(spec->target, buf);
			glBufferData(spec->target, spec->size, refBuf.getPtr(), spec->usage);

			checkError();

			iterOk = verifier.verify(buf, refBuf.getPtr(), 0, spec->size, spec->target);

			if (!iterOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				break;
			}
		}

		deleteBuffer(buf);
		return STOP;
	}